

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O3

void __thiscall
ConvertedString::ConvertedString(ConvertedString *this,char *fortran_str,size_t size)

{
  kmp_info_t *th;
  int iVar1;
  char *__dest;
  
  iVar1 = __kmp_get_global_thread_id();
  th = __kmp_threads[iVar1];
  this->th = th;
  __dest = (char *)___kmp_thread_malloc(th,size + 1);
  this->buf = __dest;
  strncpy(__dest,fortran_str,size);
  this->buf[size] = '\0';
  return;
}

Assistant:

ConvertedString(char const *fortran_str, size_t size) {
    th = __kmp_get_thread();
    buf = (char *)__kmp_thread_malloc(th, size + 1);
    KMP_STRNCPY_S(buf, size + 1, fortran_str, size);
    buf[size] = '\0';
  }